

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPointPointShape.cpp
# Opt level: O2

void __thiscall
chrono::ChPointPointShape::Update
          (ChPointPointShape *this,ChPhysicsItem *updater,ChFrame<double> *frame)

{
  long lVar1;
  ChLinkDistance *this_00;
  ChLinkRevoluteSpherical *this_01;
  _func_int **pp_Var2;
  ChVector<double> *__return_storage_ptr__;
  ChVector<double> *__return_storage_ptr___00;
  ChVector<double> *pCVar3;
  ChVector<double> pt2;
  ChVector<double> pt1;
  ChVector<double> CStack_88;
  ChVector<double> local_70;
  ChVector<double> local_58;
  ChVector<double> local_40;
  
  if (updater == (ChPhysicsItem *)0x0) {
    return;
  }
  pCVar3 = &CStack_88;
  __return_storage_ptr__ = &CStack_88;
  lVar1 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkMarkers::typeinfo,0);
  if (lVar1 == 0) {
    this_00 = (ChLinkDistance *)
              __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkDistance::typeinfo,0);
    if (this_00 == (ChLinkDistance *)0x0) {
      this_01 = (ChLinkRevoluteSpherical *)
                __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkRevoluteSpherical::typeinfo,0
                              );
      if (this_01 == (ChLinkRevoluteSpherical *)0x0) {
        lVar1 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkTSDA::typeinfo,0);
        if (lVar1 == 0) {
          lVar1 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkMateGeneric::typeinfo,0);
          if (lVar1 == 0) {
            lVar1 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLink::typeinfo,0);
            if (lVar1 == 0) {
              return;
            }
            __return_storage_ptr___00 = &local_70;
            ChFrame<double>::TransformPointParentToLocal
                      (__return_storage_ptr___00,frame,
                       (ChVector<double> *)(*(long *)(lVar1 + 0x78) + 8));
            pCVar3 = (ChVector<double> *)(*(long *)(lVar1 + 0x80) + 8);
            __return_storage_ptr__ = &CStack_88;
          }
          else {
            ChFrame<double>::TransformPointLocalToParent
                      (&local_70,*(ChFrame<double> **)(lVar1 + 0x78),
                       (ChVector<double> *)(lVar1 + 0xc0));
            ChFrame<double>::TransformPointLocalToParent
                      (&CStack_88,*(ChFrame<double> **)(lVar1 + 0x80),
                       (ChVector<double> *)(lVar1 + 0x148));
            __return_storage_ptr___00 = &local_40;
            ChFrame<double>::TransformPointParentToLocal(__return_storage_ptr___00,frame,&local_70);
            __return_storage_ptr__ = &local_58;
          }
          ChFrame<double>::TransformPointParentToLocal(__return_storage_ptr__,frame,pCVar3);
          pp_Var2 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
        }
        else {
          __return_storage_ptr___00 = &local_70;
          ChFrame<double>::TransformPointParentToLocal
                    (__return_storage_ptr___00,frame,(ChVector<double> *)(lVar1 + 0xe8));
          ChFrame<double>::TransformPointParentToLocal
                    (&CStack_88,frame,(ChVector<double> *)(lVar1 + 0x100));
          pp_Var2 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
        }
        goto LAB_00d7211a;
      }
      ChLinkRevoluteSpherical::GetPoint1Abs(&CStack_88,this_01);
      ChFrame<double>::TransformPointParentToLocal(&local_70,frame,&CStack_88);
      ChLinkRevoluteSpherical::GetPoint2Abs(&local_58,this_01);
    }
    else {
      ChLinkDistance::GetEndPoint1Abs(&CStack_88,this_00);
      ChFrame<double>::TransformPointParentToLocal(&local_70,frame,&CStack_88);
      ChLinkDistance::GetEndPoint2Abs(&local_58,this_00);
    }
    pCVar3 = &local_58;
    __return_storage_ptr__ = &local_40;
  }
  else {
    ChFrame<double>::TransformPointParentToLocal
              (&local_70,frame,(ChVector<double> *)(*(long *)(lVar1 + 0xb8) + 0x250));
    pCVar3 = (ChVector<double> *)(*(long *)(lVar1 + 0xc0) + 0x250);
    __return_storage_ptr__ = &CStack_88;
  }
  __return_storage_ptr___00 = &local_70;
  ChFrame<double>::TransformPointParentToLocal(__return_storage_ptr__,frame,pCVar3);
  pp_Var2 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
LAB_00d7211a:
  (*pp_Var2[5])(this,__return_storage_ptr___00,__return_storage_ptr__);
  return;
}

Assistant:

void ChPointPointShape::Update(ChPhysicsItem* updater, const ChFrame<>& frame) {
    // Extract two positions from updater if it has any, and then update line geometry from these positions.
    if (auto link_markers = dynamic_cast<ChLinkMarkers*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link_markers->GetMarker1()->GetAbsCoord().pos),
                           frame.TransformPointParentToLocal(link_markers->GetMarker2()->GetAbsCoord().pos));
    } else if (auto link_dist = dynamic_cast<ChLinkDistance*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link_dist->GetEndPoint1Abs()),
                           frame.TransformPointParentToLocal(link_dist->GetEndPoint2Abs()));
    } else if (auto link_rs = dynamic_cast<ChLinkRevoluteSpherical*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link_rs->GetPoint1Abs()),
                           frame.TransformPointParentToLocal(link_rs->GetPoint2Abs()));
    } else if (auto link_tsda = dynamic_cast<ChLinkTSDA*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link_tsda->GetPoint1Abs()),
                           frame.TransformPointParentToLocal(link_tsda->GetPoint2Abs()));
    } else if (auto link_mate = dynamic_cast<ChLinkMateGeneric*>(updater)) {
        auto pt1 = link_mate->GetBody1()->TransformPointLocalToParent(link_mate->GetFrame1().GetPos());
        auto pt2 = link_mate->GetBody2()->TransformPointLocalToParent(link_mate->GetFrame2().GetPos());
        UpdateLineGeometry(frame.TransformPointParentToLocal(pt1), frame.TransformPointParentToLocal(pt2));
    } else if (auto link = dynamic_cast<ChLink*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link->GetBody1()->GetPos()),
                           frame.TransformPointParentToLocal(link->GetBody2()->GetPos()));
    }
}